

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_waypoints_online.cpp
# Opt level: O2

int main(void)

{
  Result RVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 *puVar4;
  string *psVar5;
  byte bVar6;
  string asStack_1db8 [3];
  InputParameter<3UL,_ruckig::StandardVector> input;
  OutputParameter<3UL,_ruckig::StandardVector> output;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  
  bVar6 = 0;
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>(&otg,0.01,10);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>(&input);
  ruckig::OutputParameter<3UL,_ruckig::StandardVector>::OutputParameter<3UL,_0>(&output,10);
  input.current_position._M_elems[0] = 0.2;
  input.current_position._M_elems[1] = 0.0;
  input.current_position._M_elems[2] = -0.3;
  input.current_velocity._M_elems[0] = 0.0;
  input.current_velocity._M_elems[1] = 0.2;
  input.current_velocity._M_elems[2] = 0.0;
  input.current_acceleration._M_elems[0]._0_4_ = 0;
  input.current_acceleration._M_elems[0]._4_4_ = 0;
  input.current_acceleration._M_elems[1]._0_4_ = 0x33333333;
  input.current_acceleration._M_elems[1]._4_4_ = 0x3fe33333;
  input.current_acceleration._M_elems[2] = 0.0;
  puVar4 = &DAT_0011c1d0;
  psVar5 = asStack_1db8;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    psVar5->_M_dataplus = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    psVar5 = (string *)((long)psVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
  _M_assign_aux<std::array<double,3ul>const*>
            ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)
             &input.intermediate_positions,asStack_1db8,&input);
  input.target_position._M_elems[2] = 0.0;
  input.target_position._M_elems[0] = 0.5;
  input.target_position._M_elems[1] = 1.0;
  input.target_velocity._M_elems[0] = 0.2;
  input.target_velocity._M_elems[1] = 0.0;
  input.target_velocity._M_elems[2] = 0.3;
  input.target_acceleration._M_elems[0] = 0.0;
  input.target_acceleration._M_elems[1] = 0.1;
  input.target_acceleration._M_elems[2] = -0.1;
  input.max_velocity._M_elems[0] = 1.0;
  input.max_velocity._M_elems[1] = 2.0;
  input.max_velocity._M_elems[2] = 1.0;
  input.max_acceleration._M_elems[0] = 3.0;
  input.max_acceleration._M_elems[1] = 2.0;
  input.max_acceleration._M_elems[2] = 2.0;
  input.max_jerk._M_elems[0] = 6.0;
  input.max_jerk._M_elems[1] = 10.0;
  input.max_jerk._M_elems[2] = 20.0;
  if (input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>._M_engaged = true;
  }
  input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload._M_value = 500.0;
  poVar2 = std::operator<<((ostream *)&std::cout,"t | position");
  std::endl<char,std::char_traits<char>>(poVar2);
  while( true ) {
    RVar1 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update(&otg,&input,&output);
    if (RVar1 != Working) break;
    if (output.new_calculation == true) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Updated the trajectory:");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&std::cout,"  Reached target position in ");
      poVar2 = std::ostream::_M_insert<double>(output.trajectory.duration);
      poVar2 = std::operator<<(poVar2," [s].");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&std::cout,"  Calculation in ");
      poVar2 = std::ostream::_M_insert<double>(output.calculation_duration);
      poVar2 = std::operator<<(poVar2,anon_var_dwarf_1a273);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::ostream::_M_insert<double>(output.time);
    poVar2 = std::operator<<(poVar2," | ");
    ruckig::join<std::array<double,3ul>>
              (asStack_1db8,(ruckig *)&output.new_position,(array<double,_3UL> *)0x0,SUB81(lVar3,0))
    ;
    poVar2 = std::operator<<(poVar2,(string *)asStack_1db8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)asStack_1db8);
    ruckig::OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input(&output,&input);
  }
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::~Trajectory(&output.trajectory);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter(&input);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::~Ruckig(&otg);
  return 0;
}

Assistant:

int main() {
    const double control_cycle = 0.01;
    const size_t DOFs = 3;
    const size_t max_number_of_waypoints = 10;  // for memory allocation

    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<DOFs> otg(control_cycle, max_number_of_waypoints);
    InputParameter<DOFs> input;
    OutputParameter<DOFs> output(max_number_of_waypoints);

    // Set input parameters
    input.current_position = {0.2, 0.0, -0.3};
    input.current_velocity = {0.0, 0.2, 0.0};
    input.current_acceleration = {0.0, 0.6, 0.0};

    input.intermediate_positions = {
        {1.4, -1.6, 1.0},
        {-0.6, -0.5, 0.4},
        {-0.4, -0.35, 0.0},
        {0.8, 1.8, -0.1}
    };

    input.target_position = {0.5, 1.0, 0.0};
    input.target_velocity = {0.2, 0.0, 0.3};
    input.target_acceleration = {0.0, 0.1, -0.1};

    input.max_velocity = {1.0, 2.0, 1.0};
    input.max_acceleration = {3.0, 2.0, 2.0};
    input.max_jerk = {6.0, 10.0, 20.0};

    input.interrupt_calculation_duration = 500; // [µs]

    std::cout << "t | position" << std::endl;
    double calculation_duration = 0.0;
    while (otg.update(input, output) == Result::Working) {
        if (output.new_calculation) {
            std::cout << "Updated the trajectory:" << std::endl;
            std::cout << "  Reached target position in " << output.trajectory.get_duration() << " [s]." << std::endl;
            std::cout << "  Calculation in " << output.calculation_duration << " [µs]." << std::endl;
        }

        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);
    }
}